

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O2

int newUser(string *cmd,int socket_fd)

{
  _Iter_pred<newUser(std::__cxx11::string,int)::__0> *this;
  pointer paVar1;
  undefined4 __fd;
  char cVar2;
  bool bVar3;
  ssize_t sVar4;
  ostream *poVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> __it;
  ostream local_318 [8];
  ofstream usersFile;
  string local_118 [32];
  string local_f8 [8];
  string password;
  undefined1 local_c8 [8];
  size_type sStack_c0;
  undefined1 local_b8 [8];
  vector<User,_std::allocator<User>_> users;
  undefined1 local_90 [24];
  string username;
  _Alloc_hider local_50;
  size_type sStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::__cxx11::string::find((char *)cmd,0x1091c9);
  std::__cxx11::string::substr((ulong)(local_90 + 0x10),(ulong)cmd);
  std::__cxx11::string::substr((ulong)local_f8,(ulong)cmd);
  std::ofstream::ofstream(local_318,"../users.txt",_S_app);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Could not open user.txt file");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar6 = -1;
    goto LAB_00106c74;
  }
  getUsers();
  paVar1 = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((username._M_dataplus._M_p < (pointer)0x20) && (password._M_dataplus._M_p + -4 < (pointer)0x5)
     ) {
    std::__cxx11::string::string(local_118,(string *)(local_90 + 0x10));
    std::__cxx11::string::string
              ((string *)
               &users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_118);
    username.field_2._8_8_ = &local_50;
    if (users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage == (pointer)local_90) {
      sStack_48 = local_90._8_8_;
      users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)username.field_2._8_8_;
    }
    local_90[0] = 0;
    password.field_2._8_8_ =
         users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if (users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage == (pointer)username.field_2._8_8_) {
      sStack_c0 = sStack_48;
      password.field_2._8_8_ = local_c8;
    }
    local_50._M_p = (pointer)((ulong)(uint7)local_90._1_7_ << 8);
    users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_90;
    local_40._12_4_ = socket_fd;
    std::__cxx11::string::~string((string *)(username.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)(username.field_2._M_local_buf + 8),
               (string *)(password.field_2._M_local_buf + 8));
    local_40._M_allocated_capacity = (size_type)paVar1;
    lVar7 = (long)paVar1 - (long)local_b8;
    this = (_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)(username.field_2._M_local_buf + 8)
    ;
    __it._M_current = (anon_struct_64_2_84df61a8 *)local_b8;
    for (lVar10 = lVar7 >> 8; uVar9 = __it._M_current, 0 < lVar10; lVar10 = lVar10 + -1) {
      bVar3 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                        (this,__it);
      if (bVar3) goto LAB_00106e2e;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                        (this,__it._M_current + 1);
      uVar9 = __it._M_current + 1;
      if (bVar3) goto LAB_00106e2e;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                        (this,__it._M_current + 2);
      uVar9 = __it._M_current + 2;
      if (bVar3) goto LAB_00106e2e;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                        (this,__it._M_current + 3);
      uVar9 = __it._M_current + 3;
      if (bVar3) goto LAB_00106e2e;
      __it._M_current = __it._M_current + 4;
      lVar7 = lVar7 + -0x100;
    }
    lVar7 = lVar7 >> 6;
    uVar8 = local_40._M_allocated_capacity;
    if (lVar7 == 1) {
LAB_00106e1c:
      bVar3 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                        ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)
                         (username.field_2._M_local_buf + 8),__it);
      uVar9 = uVar8;
      if (bVar3) {
        uVar9 = __it._M_current;
      }
    }
    else if (lVar7 == 2) {
LAB_00106df7:
      uVar8 = local_40._M_allocated_capacity;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                        ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)
                         (username.field_2._M_local_buf + 8),
                         (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)uVar9
                        );
      if (!bVar3) {
        __it._M_current = (anon_struct_64_2_84df61a8 *)(uVar9 + 0x40);
        goto LAB_00106e1c;
      }
    }
    else {
      uVar9 = local_40._M_allocated_capacity;
      if ((lVar7 == 3) &&
         (bVar3 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                            ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)
                             (username.field_2._M_local_buf + 8),__it), uVar9 = __it._M_current,
         !bVar3)) {
        uVar9 = __it._M_current + 1;
        goto LAB_00106df7;
      }
    }
LAB_00106e2e:
    std::__cxx11::string::~string((string *)(username.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(password.field_2._M_local_buf + 8));
    std::__cxx11::string::~string
              ((string *)
               &users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_118);
    if ((pointer)uVar9 ==
        users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      poVar5 = std::endl<char,std::char_traits<char>>(local_318);
      __fd = local_40._12_4_;
      iVar6 = 1;
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = std::operator<<(poVar5,(string *)(local_90 + 0x10));
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,local_f8);
      std::operator<<(poVar5,")");
      sVar4 = send(__fd,"User successfully added!",0x1e,0);
      if (sVar4 == -1) {
        perror("send");
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"User ");
      poVar5 = std::operator<<(poVar5,(string *)(local_90 + 0x10));
      poVar5 = std::operator<<(poVar5," successfully added");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      sVar4 = send(local_40._12_4_,"User already Exists",0x19,0);
      if (sVar4 == -1) {
        perror("send");
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"User ");
      poVar5 = std::operator<<(poVar5,(string *)(local_90 + 0x10));
      poVar5 = std::operator<<(poVar5," already exists");
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar6 = -1;
    }
  }
  else {
    sVar4 = send(socket_fd,"User/password not in bounds",0x1e,0);
    if (sVar4 == -1) {
      perror("send");
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"User ");
    poVar5 = std::operator<<(poVar5,(string *)(local_90 + 0x10));
    poVar5 = std::operator<<(poVar5,"out of bounds");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar6 = -2;
  }
  std::vector<User,_std::allocator<User>_>::~vector((vector<User,_std::allocator<User>_> *)local_b8)
  ;
LAB_00106c74:
  std::ofstream::~ofstream(local_318);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string((string *)(local_90 + 0x10));
  return iVar6;
}

Assistant:

int newUser(string cmd, int socket_fd){

    //parse the username and password from the command string
    size_t spacePos = cmd.find(" ");
    string username = cmd.substr(0,spacePos);
    string password = cmd.substr(spacePos+1);


    //open the user file
    ofstream usersFile("../users.txt", std::ios_base::app);

    //make sure the file is open
    if(!usersFile.is_open()){
        cerr << "Could not open user.txt file" << endl;
        return -1;
    }

    //get the list of current users
    vector<User> users = getUsers();

    //check that everything is gucci
    if(username.length() < 32 && password.length() > 3 && password.length() < 9){

        //search the currently added users
        auto it = find_if(users.begin(),users.end(),[username](User u){
            return (u.username == username);
        });

        //if it was not found, add the user
        if(it == users.end()){

            //add the new user to the file
            usersFile << endl << "(" << username << ", " << password << ")";

            //send confirmation to client that everythings good
            if(send(socket_fd,"User successfully added!", 30, 0) == -1)
                perror("send");

            //server note
            cout << "User "<< username << " successfully added" << endl;
            return 1;
        }


        //the user already exists
        if(send(socket_fd, "User already Exists",25,0) == -1)
            perror("send");
        cout << "User " << username << " already exists" << endl;
        //return the error
        return USER_EXISTS;

    }

    if(send(socket_fd, "User/password not in bounds",30,0) == -1)
            perror("send");

    cout << "User " << username << "out of bounds" << endl;
    //return the specific error code
    return UP_NOT_IN_BOUNDS;

}